

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void initialize_impute_calc<ImputedData<long,double>,PredictionData<float,long>>
               (ImputedData<long,_double> *imp,PredictionData<float,_long> *prediction_data,
               Imputer *imputer,size_t row)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  size_t *psVar2;
  float *pfVar3;
  pointer puVar4;
  long *plVar5;
  long *plVar6;
  pointer plVar7;
  int *piVar8;
  pointer pvVar9;
  pointer pdVar10;
  value_type_conflict in_RAX;
  ulong uVar11;
  size_t sVar12;
  unsigned_long uVar13;
  long lVar14;
  pointer pdVar15;
  vector<double,_std::allocator<double>_> *this;
  long lVar16;
  size_t __n;
  size_t col;
  size_t sVar17;
  value_type_conflict local_38;
  
  imp->n_missing_num = 0;
  imp->n_missing_cat = 0;
  imp->n_missing_sp = 0;
  local_38 = in_RAX;
  if (prediction_data->numeric_data == (float *)0x0) {
    if (prediction_data->Xr != (float *)0x0) {
      if ((imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<long,_std::allocator<long>_>::resize(&imp->missing_sp,imputer->ncols_numeric);
      }
      plVar5 = prediction_data->Xr_indptr;
      lVar16 = plVar5[row];
      lVar14 = plVar5[row + 1];
      if (lVar16 < lVar14) {
        pfVar3 = prediction_data->Xr;
        plVar6 = prediction_data->Xr_ind;
        plVar7 = (imp->missing_sp).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (0x7f7fffff < (uint)ABS(pfVar3[lVar16])) {
            lVar14 = plVar6[lVar16];
            sVar12 = imp->n_missing_sp;
            imp->n_missing_sp = sVar12 + 1;
            plVar7[sVar12] = lVar14;
            lVar14 = plVar5[row + 1];
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 < lVar14);
      }
      pdVar15 = (imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((imp->sp_num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish != pdVar15) {
        if (imp->n_missing_sp == 0) goto LAB_002def4f;
        __n = imp->n_missing_sp << 3;
        memset(pdVar15,0,__n);
        pdVar15 = (imp->sp_num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        goto LAB_002deefe;
      }
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize
                (&imp->sp_num_sum,imputer->ncols_numeric,&local_38);
      this = &imp->sp_num_weight;
      goto LAB_002def40;
    }
  }
  else {
    pvVar1 = &imp->missing_num;
    if ((imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        (imp->missing_num).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
        .super__Vector_impl_data._M_start) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                (pvVar1,imputer->ncols_numeric);
    }
    psVar2 = &imp->n_missing_num;
    sVar12 = imputer->ncols_numeric;
    if (prediction_data->is_col_major == false) {
      if (sVar12 == 0) goto LAB_002deed9;
      pfVar3 = prediction_data->numeric_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        if (0x7f7fffff < (*(uint *)((long)pfVar3 + uVar13 * 4 + row * 4 * sVar12) & 0x7fffffff)) {
          sVar12 = *psVar2;
          *psVar2 = sVar12 + 1;
          puVar4[sVar12] = uVar13;
          sVar12 = imputer->ncols_numeric;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < sVar12);
    }
    else if (sVar12 == 0) {
LAB_002deed9:
      sVar12 = 0;
    }
    else {
      pfVar3 = prediction_data->numeric_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = 0;
      do {
        if (0x7f7fffff < (uint)ABS(pfVar3[row + prediction_data->nrows * uVar13])) {
          sVar12 = *psVar2;
          *psVar2 = sVar12 + 1;
          puVar4[sVar12] = uVar13;
          sVar12 = imputer->ncols_numeric;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < sVar12);
    }
    pdVar15 = (imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imp->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish == pdVar15) {
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(&imp->num_sum,sVar12,&local_38);
      this = &imp->num_weight;
LAB_002def40:
      local_38 = 0.0;
      std::vector<double,_std::allocator<double>_>::resize(this,imputer->ncols_numeric,&local_38);
    }
    else if (*psVar2 != 0) {
      __n = *psVar2 << 3;
      memset(pdVar15,0,__n);
      pdVar15 = (imp->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
LAB_002deefe:
      memset(pdVar15,0,__n);
    }
  }
LAB_002def4f:
  if (prediction_data->categ_data == (int *)0x0) {
    return;
  }
  pvVar1 = &imp->missing_cat;
  if ((imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(pvVar1,imputer->ncols_categ);
  }
  sVar12 = imputer->ncols_categ;
  if (prediction_data->is_col_major == false) {
    if (sVar12 != 0) {
      piVar8 = prediction_data->categ_data;
      puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        if (*(int *)((long)piVar8 + uVar11 * 4 + row * 4 * sVar12) < 0) {
          sVar12 = imp->n_missing_cat;
          imp->n_missing_cat = sVar12 + 1;
          puVar4[sVar12] = uVar11;
          sVar12 = imputer->ncols_categ;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < sVar12);
      goto LAB_002df020;
    }
  }
  else if (sVar12 != 0) {
    piVar8 = prediction_data->categ_data;
    puVar4 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      if (piVar8[row + prediction_data->nrows * uVar11] < 0) {
        sVar12 = imp->n_missing_cat;
        imp->n_missing_cat = sVar12 + 1;
        puVar4[sVar12] = uVar11;
        sVar12 = imputer->ncols_categ;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < sVar12);
    goto LAB_002df020;
  }
  sVar12 = 0;
LAB_002df020:
  pdVar15 = (imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((imp->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish == pdVar15) {
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::resize(&imp->cat_weight,sVar12,&local_38);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&imp->cat_sum,imputer->ncols_categ);
    if (imputer->ncols_categ != 0) {
      lVar16 = 0;
      uVar11 = 0;
      do {
        local_38 = 0.0;
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(((imp->cat_sum).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar16),
                   (long)(imputer->ncat).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11],&local_38);
        uVar11 = uVar11 + 1;
        lVar16 = lVar16 + 0x18;
      } while (uVar11 < imputer->ncols_categ);
    }
  }
  else {
    sVar12 = imp->n_missing_cat;
    if (sVar12 != 0) {
      sVar17 = 0;
      memset(pdVar15,0,sVar12 * 8);
      pvVar9 = (imp->cat_sum).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar4 = (imp->missing_cat).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        uVar13 = puVar4[sVar17];
        pdVar15 = pvVar9[uVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar10 = *(pointer *)
                   ((long)&pvVar9[uVar13].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data + 8);
        if (pdVar15 != pdVar10) {
          memset(pdVar15,0,((long)pdVar10 + (-8 - (long)pdVar15) & 0xfffffffffffffff8U) + 8);
        }
        sVar17 = sVar17 + 1;
      } while (sVar12 != sVar17);
    }
  }
  return;
}

Assistant:

void initialize_impute_calc(ImputedData &imp, PredictionData &prediction_data, Imputer &imputer, size_t row)
{
    imp.n_missing_num = 0;
    imp.n_missing_cat = 0;
    imp.n_missing_sp  = 0;

    if (prediction_data.numeric_data != NULL)
    {
        if (!imp.missing_num.size())
            imp.missing_num.resize(imputer.ncols_numeric);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_numeric; col++)
                if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    imp.missing_num[imp.n_missing_num++] = col;
        }

        if (!imp.num_sum.size())
        {
            imp.num_sum.resize(imputer.ncols_numeric,    0);
            imp.num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.num_sum.begin(),     imp.num_sum.begin()    + imp.n_missing_num,  0);
            std::fill(imp.num_weight.begin(),  imp.num_weight.begin() + imp.n_missing_num,  0);
        }
    }

    else if (prediction_data.Xr != NULL)
    {
        if (!imp.missing_sp.size())
            imp.missing_sp.resize(imputer.ncols_numeric);
        for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            if (is_na_or_inf(prediction_data.Xr[ix]))
                imp.missing_sp[imp.n_missing_sp++] = prediction_data.Xr_ind[ix];

        if (!imp.sp_num_sum.size())
        {
            imp.sp_num_sum.resize(imputer.ncols_numeric,    0);
            imp.sp_num_weight.resize(imputer.ncols_numeric, 0);
        }

        else
        {
            std::fill(imp.sp_num_sum.begin(),     imp.sp_num_sum.begin()    + imp.n_missing_sp,  0);
            std::fill(imp.sp_num_weight.begin(),  imp.sp_num_weight.begin() + imp.n_missing_sp,  0);
        }
    }
    
    if (prediction_data.categ_data != NULL)
    {
        if (!imp.missing_cat.size())
            imp.missing_cat.resize(imputer.ncols_categ);

        if (prediction_data.is_col_major)
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        else
        {
            for (size_t col = 0; col < imputer.ncols_categ; col++)
            {
                if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    imp.missing_cat[imp.n_missing_cat++] = col;
            }
        }

        if (!imp.cat_weight.size())
        {
            imp.cat_weight.resize(imputer.ncols_categ, 0);
            imp.cat_sum.resize(imputer.ncols_categ);
            for (size_t col = 0; col < imputer.ncols_categ; col++)
                imp.cat_sum[col].resize(imputer.ncat[col], 0);
        }

        else
        {
            std::fill(imp.cat_weight.begin(), imp.cat_weight.begin() + imp.n_missing_cat, 0);
            for (size_t col = 0; col < imp.n_missing_cat; col++)
                std::fill(imp.cat_sum[imp.missing_cat[col]].begin(),
                          imp.cat_sum[imp.missing_cat[col]].end(),
                          0);
        }
    }
}